

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::RenderbufferBindingTestCase::test
          (RenderbufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  allocator<char> local_dd;
  GLuint renderBuffer;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  code *local_38;
  GLenum local_30;
  
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca7,0,(this->super_BindingTest).m_type)
  ;
  renderBuffer = 0;
  glu::CallLogWrapper::glGenRenderbuffers(gl,1,&renderBuffer);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glGenRenderbuffers");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  glu::CallLogWrapper::glBindRenderbuffer(gl,0x8d41,renderBuffer);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glBindRenderbuffer");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8ca7,renderBuffer,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteRenderbuffers(gl,1,&renderBuffer);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glDeleteRenderbuffers");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca7,0,(this->super_BindingTest).m_type)
  ;
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		verifyStateInteger(result, gl, GL_RENDERBUFFER_BINDING, 0, m_type);

		GLuint renderBuffer = 0;
		gl.glGenRenderbuffers(1, &renderBuffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenRenderbuffers");

		gl.glBindRenderbuffer(GL_RENDERBUFFER, renderBuffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindRenderbuffer");

		verifyStateInteger(result, gl, GL_RENDERBUFFER_BINDING, renderBuffer, m_type);

		gl.glDeleteRenderbuffers(1, &renderBuffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteRenderbuffers");

		verifyStateInteger(result, gl, GL_RENDERBUFFER_BINDING, 0, m_type);
	}